

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O0

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindGreaterOrEqual
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key,Node **prev)

{
  bool bVar1;
  int iVar2;
  Node *n;
  Node *next;
  Node *pNStack_28;
  int level;
  Node *x;
  Node **prev_local;
  char **key_local;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this_local;
  
  n = this->head_;
  iVar2 = GetMaxHeight(this);
  next._4_4_ = iVar2 + -1;
  while( true ) {
    do {
      pNStack_28 = n;
      n = Node::Next(pNStack_28,next._4_4_);
      bVar1 = KeyIsAfterNode(this,key,n);
    } while (bVar1);
    if (prev != (Node **)0x0) {
      prev[next._4_4_] = pNStack_28;
    }
    if (next._4_4_ == 0) break;
    next._4_4_ = next._4_4_ + -1;
    n = pNStack_28;
  }
  return n;
}

Assistant:

typename SkipList<Key, Comparator>::Node*
SkipList<Key, Comparator>::FindGreaterOrEqual(const Key& key,
                                              Node** prev) const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    Node* next = x->Next(level);
    if (KeyIsAfterNode(key, next)) {
      // Keep searching in this list
      x = next;
    } else {
      if (prev != nullptr) prev[level] = x;
      if (level == 0) {
        return next;
      } else {
        // Switch to next list
        level--;
      }
    }
  }
}